

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distribution.cpp
# Opt level: O2

void __thiscall
MxxDistribution_StableBlockDistr_Test::MxxDistribution_StableBlockDistr_Test
          (MxxDistribution_StableBlockDistr_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0015af90;
  return;
}

Assistant:

TEST(MxxDistribution, StableBlockDistr) {
    mxx::comm c;

    // create unequal distribution
    size_t size = 100 + 10 * c.rank();
    std::vector<std::pair<int,int>> vec(size);

    // initialze with unique ids
    size_t prefix = mxx::exscan(size, c);
    size_t total_size = mxx::allreduce(size, c);
    std::srand(13*c.rank());
    for (size_t i = 0; i < size; ++i) {
        vec[i].first = prefix+i;
        vec[i].second = std::rand();
    }

    // test stable distribute of vector
    std::vector<std::pair<int,int>> eq_distr = mxx::stable_distribute(vec, c);
    // test in-place version
    mxx::stable_distribute_inplace(vec, c);

    size_t eq_size = total_size / c.size();
    if ((size_t)c.rank() < total_size % c.size())
        eq_size+=1;
    size_t eq_prefix = mxx::exscan(eq_size, c);
    auto cmp = [](const std::pair<int,int>& x, const std::pair<int,int>& y){
        return x.first < y.first;
    };
    ASSERT_TRUE(mxx::is_sorted(eq_distr.begin(), eq_distr.end(), cmp, c));
    ASSERT_TRUE(mxx::is_sorted(vec.begin(), vec.end(), cmp, c));
    ASSERT_EQ(eq_size, eq_distr.size());
    ASSERT_EQ(eq_size, vec.size());
    for (size_t i = 0; i < eq_distr.size(); ++i) {
        ASSERT_EQ(eq_prefix+i,(size_t)eq_distr[i].first);
        ASSERT_EQ(eq_prefix+i,(size_t)vec[i].first);
    }
}